

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O2

IOTHUB_MESSAGE_RESULT
IoTHubMessage_SetProperty(IOTHUB_MESSAGE_HANDLE msg_handle,char *key,char *value)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  char *pcVar5;
  
  if ((key == (char *)0x0 || msg_handle == (IOTHUB_MESSAGE_HANDLE)0x0) || value == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar4 = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else {
      IVar4 = IOTHUB_MESSAGE_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetProperty",0x221,1,
                "invalid parameter (NULL) to IoTHubMessage_SetProperty iotHubMessageHandle=%p, key=%p, value=%p"
                ,msg_handle,key,value);
    }
  }
  else {
    MVar1 = Map_AddOrUpdate(msg_handle->properties,key,value);
    if (MVar1 == MAP_OK) {
      IVar4 = IOTHUB_MESSAGE_OK;
    }
    else {
      if (MVar1 == MAP_FILTER_REJECT) {
        p_Var2 = xlogging_get_log_function();
        IVar4 = IOTHUB_MESSAGE_INVALID_TYPE;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return IOTHUB_MESSAGE_INVALID_TYPE;
        }
        pcVar5 = "Failure validating property as ASCII";
        iVar3 = 0x229;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        IVar4 = IOTHUB_MESSAGE_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return IOTHUB_MESSAGE_ERROR;
        }
        pcVar5 = "Failure adding property to internal map";
        iVar3 = 0x22e;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_SetProperty",iVar3,1,pcVar5);
    }
  }
  return IVar4;
}

Assistant:

IOTHUB_MESSAGE_RESULT IoTHubMessage_SetProperty(IOTHUB_MESSAGE_HANDLE msg_handle, const char* key, const char* value)
{
    IOTHUB_MESSAGE_RESULT result;
    if (msg_handle == NULL || key == NULL || value == NULL)
    {
        LogError("invalid parameter (NULL) to IoTHubMessage_SetProperty iotHubMessageHandle=%p, key=%p, value=%p", msg_handle, key, value);
        result = IOTHUB_MESSAGE_INVALID_ARG;
    }
    else
    {
        MAP_RESULT map_result = Map_AddOrUpdate(msg_handle->properties, key, value);
        if (map_result == MAP_FILTER_REJECT)
        {
            LogError("Failure validating property as ASCII");
            result = IOTHUB_MESSAGE_INVALID_TYPE;
        }
        else if (map_result != MAP_OK)
        {
            LogError("Failure adding property to internal map");
            result = IOTHUB_MESSAGE_ERROR;
        }
        else
        {
            result = IOTHUB_MESSAGE_OK;
        }
    }
    return result;
}